

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O0

int coda__pcre2_auto_possessify_8(PCRE2_UCHAR8 *code,compile_block_8 *cb)

{
  PCRE2_UCHAR8 PVar1;
  byte bVar2;
  uint utf_00;
  uint ucp_00;
  BOOL BVar3;
  PCRE2_SPTR8 code_00;
  bool local_71;
  PCRE2_SPTR8 local_70;
  BOOL ucp;
  BOOL utf;
  int rec_limit;
  uint32_t list [8];
  PCRE2_UCHAR8 *repeat_opcode;
  PCRE2_SPTR8 end;
  PCRE2_UCHAR8 c;
  compile_block_8 *cb_local;
  PCRE2_UCHAR8 *code_local;
  
  ucp = 1000;
  utf_00 = (uint)((cb->external_options & 0x80000) != 0);
  ucp_00 = (uint)((cb->external_options & 0x20000) != 0);
  for (cb_local = (compile_block_8 *)code; end._7_1_ = *(byte *)&cb_local->cx, end._7_1_ < 0xab;
      cb_local = (compile_block_8 *)
                 ((long)cb_local->small_ref_offset +
                 (long)(int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                                  [end._7_1_] + -0x58)) {
    if ((end._7_1_ < 0x21) || (0x61 < end._7_1_)) {
      if ((end._7_1_ == 0x6e) || ((end._7_1_ == 0x6f || (end._7_1_ == 0x70)))) {
        list._24_8_ = (long)&cb_local->ctypes + 1;
        bVar2 = *(byte *)list._24_8_;
        if ((0x61 < bVar2) && (bVar2 < 0x6a)) {
          code_00 = get_chr_property_list
                              ((PCRE2_SPTR8)cb_local,utf_00,ucp_00,cb->fcc,(uint32_t *)&utf);
          rec_limit = (int)((bVar2 & 1) == 0);
          if ((code_00 != (PCRE2_SPTR8)0x0) &&
             (BVar3 = compare_opcodes(code_00,utf_00,ucp_00,cb,(uint32_t *)&utf,code_00,&ucp),
             BVar3 != 0)) {
            switch(bVar2) {
            case 0x62:
            case 99:
              *(undefined1 *)list._24_8_ = 0x6a;
              break;
            case 100:
            case 0x65:
              *(undefined1 *)list._24_8_ = 0x6b;
              break;
            case 0x66:
            case 0x67:
              *(undefined1 *)list._24_8_ = 0x6c;
              break;
            case 0x68:
            case 0x69:
              *(undefined1 *)list._24_8_ = 0x6d;
            }
          }
        }
        end._7_1_ = *(byte *)&cb_local->cx;
      }
    }
    else {
      PVar1 = get_repeat_base(end._7_1_);
      bVar2 = end._7_1_ - (PVar1 + 0xdf);
      if (bVar2 < 0x29) {
        local_70 = get_chr_property_list
                             ((PCRE2_SPTR8)cb_local,utf_00,ucp_00,cb->fcc,(uint32_t *)&utf);
      }
      else {
        local_70 = (PCRE2_SPTR8)0x0;
      }
      local_71 = true;
      if (((bVar2 != 0x21) && (local_71 = true, bVar2 != 0x23)) && (local_71 = true, bVar2 != 0x25))
      {
        local_71 = bVar2 == 0x27;
      }
      rec_limit = (int)local_71;
      if ((local_70 != (PCRE2_SPTR8)0x0) &&
         (BVar3 = compare_opcodes(local_70,utf_00,ucp_00,cb,(uint32_t *)&utf,local_70,&ucp),
         BVar3 != 0)) {
        switch(bVar2) {
        case 0x21:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\t';
          break;
        case 0x22:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\b';
          break;
        case 0x23:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\b';
          break;
        case 0x24:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\a';
          break;
        case 0x25:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\a';
          break;
        case 0x26:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\x06';
          break;
        case 0x27:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\x06';
          break;
        case 0x28:
          *(char *)&cb_local->cx = *(char *)&cb_local->cx + '\x05';
        }
      }
      end._7_1_ = *(byte *)&cb_local->cx;
    }
    switch(end._7_1_) {
    case 0:
      return 0;
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5e:
    case 0x5f:
    case 0x60:
      if ((*(char *)((long)&cb_local->cx + 1) == '\x10') ||
         (*(char *)((long)&cb_local->cx + 1) == '\x0f')) {
        cb_local = (compile_block_8 *)((long)&cb_local->cx + 2);
      }
      break;
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x61:
      if ((*(char *)((long)&cb_local->cx + 3) == '\x10') ||
         (*(char *)((long)&cb_local->cx + 3) == '\x0f')) {
        cb_local = (compile_block_8 *)((long)&cb_local->cx + 2);
      }
      break;
    case 0x77:
      cb_local = (compile_block_8 *)
                 ((long)cb_local->small_ref_offset +
                 ((ulong)CONCAT11(*(undefined1 *)((long)&cb_local->cx + 5),
                                  *(undefined1 *)((long)&cb_local->cx + 6)) - 0x58));
      break;
    case 0x9a:
    case 0x9c:
    case 0x9e:
    case 0xa0:
    case 0xa2:
      cb_local = (compile_block_8 *)
                 ((long)cb_local->small_ref_offset +
                 (long)(int)(uint)*(byte *)((long)&cb_local->cx + 1) + -0x58);
    }
  }
  return -1;
}

Assistant:

int
PRIV(auto_possessify)(PCRE2_UCHAR *code, const compile_block *cb)
{
PCRE2_UCHAR c;
PCRE2_SPTR end;
PCRE2_UCHAR *repeat_opcode;
uint32_t list[8];
int rec_limit = 1000;  /* Was 10,000 but clang+ASAN uses a lot of stack. */
BOOL utf = (cb->external_options & PCRE2_UTF) != 0;
BOOL ucp = (cb->external_options & PCRE2_UCP) != 0;

for (;;)
  {
  c = *code;

  if (c >= OP_TABLE_LENGTH) return -1;   /* Something gone wrong */

  if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
    {
    c -= get_repeat_base(c) - OP_STAR;
    end = (c <= OP_MINUPTO) ?
      get_chr_property_list(code, utf, ucp, cb->fcc, list) : NULL;
    list[1] = c == OP_STAR || c == OP_PLUS || c == OP_QUERY || c == OP_UPTO;

    if (end != NULL && compare_opcodes(end, utf, ucp, cb, list, end,
        &rec_limit))
      {
      switch(c)
        {
        case OP_STAR:
        *code += OP_POSSTAR - OP_STAR;
        break;

        case OP_MINSTAR:
        *code += OP_POSSTAR - OP_MINSTAR;
        break;

        case OP_PLUS:
        *code += OP_POSPLUS - OP_PLUS;
        break;

        case OP_MINPLUS:
        *code += OP_POSPLUS - OP_MINPLUS;
        break;

        case OP_QUERY:
        *code += OP_POSQUERY - OP_QUERY;
        break;

        case OP_MINQUERY:
        *code += OP_POSQUERY - OP_MINQUERY;
        break;

        case OP_UPTO:
        *code += OP_POSUPTO - OP_UPTO;
        break;

        case OP_MINUPTO:
        *code += OP_POSUPTO - OP_MINUPTO;
        break;
        }
      }
    c = *code;
    }
  else if (c == OP_CLASS || c == OP_NCLASS || c == OP_XCLASS)
    {
#ifdef SUPPORT_WIDE_CHARS
    if (c == OP_XCLASS)
      repeat_opcode = code + GET(code, 1);
    else
#endif
      repeat_opcode = code + 1 + (32 / sizeof(PCRE2_UCHAR));

    c = *repeat_opcode;
    if (c >= OP_CRSTAR && c <= OP_CRMINRANGE)
      {
      /* The return from get_chr_property_list() will never be NULL when
      *code (aka c) is one of the three class opcodes. However, gcc with
      -fanalyzer notes that a NULL return is possible, and grumbles. Hence we
      put in a check. */

      end = get_chr_property_list(code, utf, ucp, cb->fcc, list);
      list[1] = (c & 1) == 0;

      if (end != NULL &&
          compare_opcodes(end, utf, ucp, cb, list, end, &rec_limit))
        {
        switch (c)
          {
          case OP_CRSTAR:
          case OP_CRMINSTAR:
          *repeat_opcode = OP_CRPOSSTAR;
          break;

          case OP_CRPLUS:
          case OP_CRMINPLUS:
          *repeat_opcode = OP_CRPOSPLUS;
          break;

          case OP_CRQUERY:
          case OP_CRMINQUERY:
          *repeat_opcode = OP_CRPOSQUERY;
          break;

          case OP_CRRANGE:
          case OP_CRMINRANGE:
          *repeat_opcode = OP_CRPOSRANGE;
          break;
          }
        }
      }
    c = *code;
    }

  switch(c)
    {
    case OP_END:
    return 0;

    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    if (code[1] == OP_PROP || code[1] == OP_NOTPROP) code += 2;
    break;

    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSUPTO:
    if (code[1 + IMM2_SIZE] == OP_PROP || code[1 + IMM2_SIZE] == OP_NOTPROP)
      code += 2;
    break;

    case OP_CALLOUT_STR:
    code += GET(code, 1 + 2*LINK_SIZE);
    break;

#ifdef SUPPORT_WIDE_CHARS
    case OP_XCLASS:
    code += GET(code, 1);
    break;
#endif

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_SKIP_ARG:
    case OP_THEN_ARG:
    code += code[1];
    break;
    }

  /* Add in the fixed length from the table */

  code += PRIV(OP_lengths)[c];

  /* In UTF-8 and UTF-16 modes, opcodes that are followed by a character may be
  followed by a multi-byte character. The length in the table is a minimum, so
  we have to arrange to skip the extra code units. */

#ifdef MAYBE_UTF_MULTI
  if (utf) switch(c)
    {
    case OP_CHAR:
    case OP_CHARI:
    case OP_NOT:
    case OP_NOTI:
    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    if (HAS_EXTRALEN(code[-1])) code += GET_EXTRALEN(code[-1]);
    break;
    }
#else
  (void)(utf);  /* Keep compiler happy by referencing function argument */
#endif  /* SUPPORT_WIDE_CHARS */
  }
}